

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMeshControl::AddBoundaryInterfaceElements(TPZMHMeshControl *this)

{
  uint uVar1;
  int iVar2;
  TPZCompEl **ppTVar3;
  TPZGeoEl *pTVar4;
  iterator iVar5;
  TPZInterfaceElement *this_00;
  long lVar6;
  ulong uVar7;
  int64_t iVar8;
  long nelem;
  bool bVar9;
  int matid;
  int local_18c;
  long local_188;
  ulong local_180;
  _func_int **local_178;
  TPZCompElSide cs;
  TPZGeoElSide gelside;
  set<int,_std::less<int>,_std::allocator<int>_> notincluded;
  TPZGeoElSide gs;
  TPZCompElSide celside;
  TPZStack<TPZCompElSide,_10> celstack;
  
  TPZCompMesh::LoadReferences(((this->fCMesh).fRef)->fPointer);
  uVar1 = ((this->fGMesh).fRef)->fPointer->fDim;
  uVar7 = (ulong)uVar1;
  notincluded._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &notincluded._M_t._M_impl.super__Rb_tree_header._M_header;
  notincluded._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  notincluded._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  notincluded._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  notincluded._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       notincluded._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &notincluded,&this->fSkeletonMatId);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &notincluded,&this->fLagrangeMatIdLeft);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &notincluded,&this->fLagrangeMatIdRight);
  lVar6 = (((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  local_18c = uVar1 - 1;
  if (lVar6 < 1) {
    lVar6 = 0;
  }
  local_178 = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  nelem = 0;
  do {
    if (nelem == lVar6) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&notincluded._M_t);
      return;
    }
    ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    if (*ppTVar3 != (TPZCompEl *)0x0) {
      pTVar4 = TPZCompEl::Reference(*ppTVar3);
      if (pTVar4 != (TPZGeoEl *)0x0) {
        iVar2 = (**(code **)(*(long *)pTVar4 + 0x210))(pTVar4);
        if (iVar2 != (int)uVar7) {
          iVar2 = (**(code **)(*(long *)pTVar4 + 0x1d0))(pTVar4);
          if (iVar2 == 0) {
            matid = pTVar4->fMatId;
            iVar5 = std::
                    _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                    find(&notincluded._M_t,&matid);
            if ((_Rb_tree_header *)iVar5._M_node == &notincluded._M_t._M_impl.super__Rb_tree_header)
            {
              iVar2 = (**(code **)(*(long *)pTVar4 + 0x210))(pTVar4);
              if (iVar2 != local_18c) {
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                           ,0x403);
              }
              TPZStack<TPZCompElSide,_10>::TPZStack(&celstack);
              iVar2 = (**(code **)(*(long *)pTVar4 + 0xf0))(pTVar4);
              gelside.fSide = iVar2 + -1;
              gelside.super_TPZSavable._vptr_TPZSavable = local_178;
              local_188 = lVar6;
              local_180 = uVar7;
              gelside.fGeoEl = pTVar4;
              TPZGeoElSide::Reference(&gelside);
              TPZGeoElSide::EqualorHigherCompElementList2(&gelside,&celstack,1,0);
              iVar8 = celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                      fNElements;
              if (celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  fNElements < 1) {
                iVar8 = 0;
              }
              lVar6 = 8;
              while( true ) {
                bVar9 = iVar8 == 0;
                iVar8 = iVar8 + -1;
                if (bVar9) break;
                cs.fEl = *(TPZCompEl **)
                          ((long)celstack.super_TPZManVector<TPZCompElSide,_10>.
                                 super_TPZVec<TPZCompElSide>.fStore + lVar6 + -8);
                cs.fSide = *(int *)((long)&(celstack.super_TPZManVector<TPZCompElSide,_10>.
                                            super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar6);
                TPZCompElSide::Reference(&gs,&cs);
                if ((gs.fGeoEl != gelside.fGeoEl) || (gs.fSide != gelside.fSide)) {
                  pTVar4 = (TPZGeoEl *)
                           (**(code **)(*(long *)gs.fGeoEl + 0x170))(gs.fGeoEl,gs.fSide,matid);
                  this_00 = (TPZInterfaceElement *)operator_new(0x80);
                  TPZInterfaceElement::TPZInterfaceElement
                            (this_00,((this->fCMesh).fRef)->fPointer,pTVar4,&cs,&celside);
                }
                lVar6 = lVar6 + 0x10;
              }
              TPZManVector<TPZCompElSide,_10>::~TPZManVector
                        (&celstack.super_TPZManVector<TPZCompElSide,_10>);
              lVar6 = local_188;
              uVar7 = local_180;
            }
          }
        }
      }
    }
    nelem = nelem + 1;
  } while( true );
}

Assistant:

void TPZMHMeshControl::AddBoundaryInterfaceElements()
{
    fCMesh->LoadReferences();
    int dim = fGMesh->Dimension();
    std::set<int> notincluded;
    notincluded.insert(fSkeletonMatId);
    notincluded.insert(fLagrangeMatIdLeft);
    notincluded.insert(fLagrangeMatIdRight);
    int64_t nel = fCMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fCMesh->ElementVec()[el];
        if (!cel) {
            continue;
        }
        TPZGeoEl *gel = cel->Reference();
        if (!gel || gel->Dimension() == dim || gel->HasSubElement()) {
            continue;
        }
        int matid = gel->MaterialId();
        if (notincluded.find(matid) != notincluded.end()) {
            continue;
        }
        if (gel->Dimension() != dim-1) {
            DebugStop();
        }
        TPZStack<TPZCompElSide> celstack;
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        TPZCompElSide celside = gelside.Reference();
        gelside.EqualorHigherCompElementList2(celstack, 1, 0);
        int64_t nst = celstack.size();
        for (int64_t i=0; i<nst; i++) {
            TPZCompElSide cs = celstack[i];
            TPZGeoElSide gs = cs.Reference();
            if (gs == gelside) {
                continue;
            }
            TPZGeoEl *gelnew = gs.Element()->CreateBCGeoEl(gs.Side(), matid);
            new TPZInterfaceElement(fCMesh, gelnew, cs, celside);

        }
    }
}